

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O1

int __thiscall
flow_cutter::PierceNodeScore::operator()
          (PierceNodeScore *this,int x,int side,bool causes_augmenting_path,int source_dist,
          int target_dist,int cutter_id)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  switch((this->config).pierce_rating) {
  case max_target_minus_source_hop_dist:
    target_dist = target_dist - source_dist;
    break;
  case min_source_hop_dist:
    target_dist = -source_dist;
    break;
  case max_target_hop_dist:
    break;
  case random:
    uVar2 = ((uint)(side != 0) + x * 2) * this->hash_factor + this->hash_offset;
    uVar3 = uVar2 / 0x7fffffff;
    target_dist = (uVar3 << 0x1f | uVar3) + uVar2;
    break;
  default:
    target_dist = 0;
  }
  iVar1 = target_dist;
  switch((this->config).avoid_augmenting_path) {
  case avoid_and_pick_best:
    iVar1 = target_dist + -1000000000;
    if (!causes_augmenting_path) {
      iVar1 = target_dist;
    }
    break;
  case do_not_avoid:
    break;
  case avoid_and_pick_oldest:
    if (causes_augmenting_path) {
      target_dist = -1000000000;
    }
    return target_dist;
  case avoid_and_pick_random:
    if (causes_augmenting_path) {
      uVar2 = ((uint)(side != 0) + x * 2) * this->hash_factor + this->hash_offset;
      uVar3 = uVar2 / 0x7fffffff;
      return uVar2 + (uVar3 << 0x1f | uVar3) + -1000000000;
    }
    break;
  default:
    return 0;
  }
  return iVar1;
}

Assistant:

int operator()(int x, int side, bool causes_augmenting_path, int source_dist,
        int target_dist, int cutter_id) const
    {

        auto random_number = [&] {
            if (side == BasicCutter::source_side)
                return (hash_factor * (unsigned)(x << 1) + hash_offset) % hash_modulo;
            else
                return (hash_factor * ((unsigned)(x << 1) + 1) + hash_offset) % hash_modulo;
        };

        int score;
        switch (config.pierce_rating) {
        case Config::PierceRating::max_target_minus_source_hop_dist:
            score = target_dist - source_dist;
            break;
        case Config::PierceRating::max_target_hop_dist:
            score = target_dist;
            break;
        case Config::PierceRating::min_source_hop_dist:
            score = -source_dist;
            break;
        case Config::PierceRating::oldest:
            score = 0;
            break;
        case Config::PierceRating::random:
            score = random_number();
            break;

        default:
            assert(false);
            score = 0;
        }
        switch (config.avoid_augmenting_path) {
        case Config::AvoidAugmentingPath::avoid_and_pick_best:
            if (causes_augmenting_path)
                score -= 1000000000;
            break;
        case Config::AvoidAugmentingPath::do_not_avoid:
            break;
        case Config::AvoidAugmentingPath::avoid_and_pick_oldest:
            if (causes_augmenting_path)
                score = -1000000000;
            break;
        case Config::AvoidAugmentingPath::avoid_and_pick_random:
            if (causes_augmenting_path)
                score = random_number() - 1000000000;
            break;
        default:
            assert(false);
            score = 0;
        }
        return score;
    }